

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

void __thiscall FTagManager::RemoveSectorTags(FTagManager *this,int sect)

{
  long lVar1;
  FTagItem *pFVar2;
  
  if (((uint)sect < (this->startForSector).Count) &&
     (lVar1 = (long)(this->startForSector).Array[sect], -1 < lVar1)) {
    for (pFVar2 = (this->allTags).Array + lVar1; pFVar2->target == sect; pFVar2 = pFVar2 + 1) {
      pFVar2->target = -1;
      pFVar2->tag = -1;
    }
  }
  return;
}

Assistant:

void FTagManager::RemoveSectorTags(int sect)
{
	if (startForSector.Size() > (unsigned int)sect)
	{
		int start = startForSector[sect];
		if (start >= 0)
		{
			while (allTags[start].target == sect)
			{
				allTags[start].tag = allTags[start].target = -1;
				start++;
			}
		}
	}
}